

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_sar_mod_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 ret;
  TCGv_i32 t;
  TCGv_i32 b_local;
  TCGv_i32 a_local;
  TCGv_i32 d_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_andi_i32_tricore(tcg_ctx,ret,b,0x1f);
  tcg_gen_sar_i32(tcg_ctx,d,a,ret);
  tcg_temp_free_i32(tcg_ctx,ret);
  return;
}

Assistant:

static void tcg_gen_sar_mod_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_andi_i32(tcg_ctx, t, b, 31);
    tcg_gen_sar_i32(tcg_ctx, d, a, t);
    tcg_temp_free_i32(tcg_ctx, t);
}